

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>
          (MessageGenerator *this,FieldDescriptor *field,Printer *p,int *cached_has_word_index)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Sub *local_3b0;
  basic_string_view<char,_std::char_traits<char>_> local_368;
  undefined1 local_351;
  anon_class_24_3_4e50317f_for_cb local_350;
  allocator<char> local_331;
  string local_330;
  anon_class_32_4_7d5c8e9e_for_cb local_310;
  allocator<char> local_2e9;
  string local_2e8;
  anon_class_24_3_0cc8e12b_for_cb local_2c8;
  allocator<char> local_299;
  string local_298;
  Sub *local_278;
  Sub local_270;
  Sub local_1b8;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined1 local_28 [8];
  int *cached_has_word_index_local;
  Printer *p_local;
  FieldDescriptor *field_local;
  MessageGenerator *this_local;
  
  local_351 = 1;
  local_278 = &local_270;
  local_28 = (undefined1  [8])cached_has_word_index;
  cached_has_word_index_local = (int *)p;
  p_local = (Printer *)field;
  field_local = (FieldDescriptor *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"comment",&local_299);
  local_2c8.p = (Printer **)&cached_has_word_index_local;
  local_2c8.field = (FieldDescriptor **)&p_local;
  local_2c8.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_1_>
            (&local_270,&local_298,&local_2c8);
  local_278 = &local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"update_cached_has_bits",&local_2e9);
  local_310.field = (FieldDescriptor **)&p_local;
  local_310.p = (Printer **)&cached_has_word_index_local;
  local_310.cached_has_word_index = (int *)local_28;
  local_310.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_2_>
            (&local_1b8,&local_2e8,&local_310);
  local_278 = &local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"check_and_update_byte_size_for_field",&local_331);
  local_350.field = (FieldDescriptor **)&p_local;
  local_350.p = (Printer **)&cached_has_word_index_local;
  local_350.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_3_>
            (&local_100,&local_330,&local_350);
  local_351 = 0;
  local_48 = &local_270;
  local_40 = 3;
  v._M_len = 3;
  v._M_array = local_48;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_368,
             "\n        $comment$;\n        $update_cached_has_bits$;\n        $check_and_update_byte_size_for_field$;\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(p,local_38._M_allocated_capacity,local_38._8_8_,local_368._M_len,
                    local_368._M_str);
  local_3b0 = (Sub *)&local_48;
  do {
    local_3b0 = local_3b0 + -1;
    io::Printer::Sub::~Sub(local_3b0);
  } while (local_3b0 != &local_270);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  return;
}

Assistant:

void MessageGenerator::EmitUpdateByteSizeForField(
    const FieldDescriptor* field, io::Printer* p,
    int& cached_has_word_index) const {
  p->Emit(
      {{"comment", [&] { PrintFieldComment(Formatter{p}, field, options_); }},
       {"update_cached_has_bits",
        [&] { MaybeEmitUpdateCachedHasbits(field, p, cached_has_word_index); }},
       {"check_and_update_byte_size_for_field",
        [&]() { EmitCheckAndUpdateByteSizeForField<kIsV2>(field, p); }}},
      R"cc(
        $comment$;
        $update_cached_has_bits$;
        $check_and_update_byte_size_for_field$;
      )cc");
}